

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.hpp
# Opt level: O1

void __thiscall inja::Environment::set_comment(Environment *this,string *open,string *close)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  ::std::__cxx11::string::_M_assign((string *)&(this->lexer_config).comment_open);
  paVar1 = &local_40.field_2;
  pcVar2 = (open->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar2,pcVar2 + open->_M_string_length);
  ::std::__cxx11::string::append((char *)&local_40);
  ::std::__cxx11::string::operator=
            ((string *)&(this->lexer_config).comment_open_force_lstrip,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  ::std::__cxx11::string::_M_assign((string *)&(this->lexer_config).comment_close);
  ::std::operator+(&local_40,"-",close);
  ::std::__cxx11::string::operator=
            ((string *)&(this->lexer_config).comment_close_force_rstrip,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  LexerConfig::update_open_chars(&this->lexer_config);
  return;
}

Assistant:

void set_comment(const std::string& open, const std::string& close) {
    lexer_config.comment_open = open;
    lexer_config.comment_open_force_lstrip = open + "-";
    lexer_config.comment_close = close;
    lexer_config.comment_close_force_rstrip = "-" + close;
    lexer_config.update_open_chars();
  }